

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int iVar1;
  string *psVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  FieldDescriptor *pFVar5;
  FieldDescriptorProto *pFVar6;
  OneofDescriptor *this_00;
  OneofDescriptorProto *proto_00;
  Descriptor *this_01;
  DescriptorProto *proto_01;
  EnumDescriptor *this_02;
  EnumDescriptorProto *proto_02;
  ExtensionRange *this_03;
  DescriptorProto_ExtensionRange *proto_03;
  DescriptorProto_ReservedRange *this_04;
  ReservedRange *pRVar7;
  MessageOptions *pMVar8;
  MessageOptions *pMVar9;
  int local_54;
  int i_7;
  ReservedRange *range;
  int local_40;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *this_local;
  
  psVar2 = name_abi_cxx11_(this);
  puVar3 = internal::HasBits<1UL>::operator[](&proto->_has_bits_,0);
  *puVar3 = *puVar3 | 1;
  pAVar4 = MessageLite::GetArenaForAllocation((MessageLite *)proto);
  internal::ArenaStringPtr::Set(&proto->name_,psVar2,pAVar4);
  i_2 = 0;
  while( true ) {
    iVar1 = field_count(this);
    if (iVar1 <= i_2) break;
    pFVar5 = field(this,i_2);
    pFVar6 = DescriptorProto::add_field(proto);
    FieldDescriptor::CopyTo(pFVar5,pFVar6);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar1 = oneof_decl_count(this);
    if (iVar1 <= i_3) break;
    this_00 = oneof_decl(this,i_3);
    proto_00 = DescriptorProto::add_oneof_decl(proto);
    OneofDescriptor::CopyTo(this_00,proto_00);
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar1 = nested_type_count(this);
    if (iVar1 <= i_4) break;
    this_01 = nested_type(this,i_4);
    proto_01 = DescriptorProto::add_nested_type(proto);
    CopyTo(this_01,proto_01);
    i_4 = i_4 + 1;
  }
  i_5 = 0;
  while( true ) {
    iVar1 = enum_type_count(this);
    if (iVar1 <= i_5) break;
    this_02 = enum_type(this,i_5);
    proto_02 = DescriptorProto::add_enum_type(proto);
    EnumDescriptor::CopyTo(this_02,proto_02);
    i_5 = i_5 + 1;
  }
  i_6 = 0;
  while( true ) {
    iVar1 = extension_range_count(this);
    if (iVar1 <= i_6) break;
    this_03 = extension_range(this,i_6);
    proto_03 = DescriptorProto::add_extension_range(proto);
    ExtensionRange::CopyTo(this_03,proto_03);
    i_6 = i_6 + 1;
  }
  local_40 = 0;
  while( true ) {
    iVar1 = extension_count(this);
    if (iVar1 <= local_40) break;
    pFVar5 = extension(this,local_40);
    pFVar6 = DescriptorProto::add_extension(proto);
    FieldDescriptor::CopyTo(pFVar5,pFVar6);
    local_40 = local_40 + 1;
  }
  range._4_4_ = 0;
  while( true ) {
    iVar1 = reserved_range_count(this);
    if (iVar1 <= range._4_4_) break;
    this_04 = DescriptorProto::add_reserved_range(proto);
    pRVar7 = reserved_range(this,range._4_4_);
    DescriptorProto_ReservedRange::set_start(this_04,pRVar7->start);
    pRVar7 = reserved_range(this,range._4_4_);
    DescriptorProto_ReservedRange::set_end(this_04,pRVar7->end);
    range._4_4_ = range._4_4_ + 1;
  }
  local_54 = 0;
  while( true ) {
    iVar1 = reserved_name_count(this);
    if (iVar1 <= local_54) break;
    psVar2 = reserved_name_abi_cxx11_(this,local_54);
    DescriptorProto::add_reserved_name(proto,psVar2);
    local_54 = local_54 + 1;
  }
  pMVar8 = options(this);
  pMVar9 = MessageOptions::default_instance();
  if (pMVar8 != pMVar9) {
    pMVar8 = DescriptorProto::mutable_options(proto);
    pMVar9 = options(this);
    MessageOptions::CopyFrom(pMVar8,pMVar9);
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}